

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

adj_list *
get_adj(adj_list *__return_storage_ptr__,int nv,vector<Arc,_std::allocator<Arc>_> *arcs,
       bool transpose)

{
  pointer pAVar1;
  pointer pvVar2;
  runtime_error *this;
  iterator __position;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_00;
  pointer pAVar3;
  char _error_msg_ [256];
  pair<int,_int> local_138 [33];
  
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(__return_storage_ptr__,(long)nv,(allocator_type *)local_138);
  pAVar3 = (arcs->super__Vector_base<Arc,_std::allocator<Arc>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pAVar1 = (arcs->super__Vector_base<Arc,_std::allocator<Arc>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  do {
    if (pAVar3 == pAVar1) {
      return __return_storage_ptr__;
    }
    if ((nv <= pAVar3->u) || (nv <= pAVar3->v)) {
      snprintf((char *)local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "a.u < nv && a.v < nv",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/graph.cpp"
               ,0x49);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,(char *)local_138);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar2 = (__return_storage_ptr__->
             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (transpose) {
      this_00 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                (pvVar2 + pAVar3->v);
      local_138[0].second = pAVar3->label;
      local_138[0].first = pAVar3->u;
      __position._M_current = *(pair<int,_int> **)(this_00 + 8);
      if (__position._M_current == *(pair<int,_int> **)(this_00 + 0x10)) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>(this_00,__position,local_138);
      }
      else {
LAB_00107d69:
        *__position._M_current = local_138[0];
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
    }
    else {
      this_00 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                (pvVar2 + pAVar3->u);
      local_138[0].first = pAVar3->v;
      local_138[0].second = pAVar3->label;
      __position._M_current = *(pair<int,_int> **)(this_00 + 8);
      if (__position._M_current != *(pair<int,_int> **)(this_00 + 0x10)) goto LAB_00107d69;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      _M_realloc_insert<std::pair<int,int>>(this_00,__position,local_138);
    }
    pAVar3 = pAVar3 + 1;
  } while( true );
}

Assistant:

adj_list get_adj(int nv, const std::vector<Arc> &arcs, bool transpose) {
	adj_list adj(nv);
	for (const Arc &a : arcs) {
		throw_assert(a.u < nv && a.v < nv);
		if (!transpose) {
			adj[a.u].push_back(MP(a.v, a.label));
		} else {
			adj[a.v].push_back(MP(a.u, a.label));
		}
	}
	return adj;
}